

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

void __thiscall
vmtz_rule::resolve(vmtz_rule *this,int32_t *dayno,int32_t *daytime,int year,vmtz_rule *prev_rule)

{
  char cVar1;
  int32_t iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  caldate_t local_2c;
  
  cVar1 = this->mm;
  local_2c.m = (int)cVar1;
  local_2c.d = 0;
  if ((byte)this->when < 4) {
    lVar3 = (long)local_2c.m;
    switch(this->when) {
    case '\0':
      local_2c.d = (int)this->dd;
      break;
    case '\x01':
      local_2c.m = local_2c.m + 1;
      iVar5 = year - (uint)(cVar1 < '\x02');
      iVar6 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      iVar7 = (int)((ulong)((long)iVar5 * -0x51eb851f) >> 0x20);
      local_2c.d = (iVar5 + (iVar6 >> 2) + ((iVar7 >> 5) - (iVar7 >> 0x1f)) + iVar5 / 400 +
                   *(int *)(caldate_t::weekday()::t + lVar3 * 4)) % 7 - (int)this->weekday;
      local_2c.d = (-(uint)(-2 < local_2c.d) | 0xfffffff8) - local_2c.d;
      break;
    case '\x02':
      iVar5 = year - (uint)(cVar1 < '\x03');
      iVar6 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      iVar7 = (int)((ulong)((long)iVar5 * -0x51eb851f) >> 0x20);
      uVar4 = ~((iVar5 / 400 + (int)this->dd +
                 iVar5 + (iVar6 >> 2) + ((iVar7 >> 5) - (iVar7 >> 0x1f)) +
                *(int *)("12julcaldate_t" + lVar3 * 4 + 0xd)) % 7);
      iVar6 = uVar4 + (int)this->weekday;
      local_2c.d = uVar4 + (int)this->weekday + 7;
      if (-1 < iVar6) {
        local_2c.d = iVar6;
      }
      local_2c.d = local_2c.d + this->dd;
      break;
    case '\x03':
      iVar5 = year - (uint)(cVar1 < '\x03');
      iVar6 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      iVar7 = (int)((ulong)((long)iVar5 * -0x51eb851f) >> 0x20);
      uVar4 = ~((iVar5 / 400 + (int)this->dd +
                 iVar5 + (iVar6 >> 2) + ((iVar7 >> 5) - (iVar7 >> 0x1f)) +
                *(int *)("12julcaldate_t" + lVar3 * 4 + 0xd)) % 7);
      iVar5 = uVar4 + (int)this->weekday;
      iVar6 = uVar4 + (int)this->weekday + 7;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      local_2c.d = this->dd + iVar6 + -7;
    }
  }
  local_2c.y = year;
  iVar2 = caldate_t::dayno(&local_2c);
  *dayno = iVar2;
  iVar6 = this->at;
  *daytime = iVar6;
  if (this->at_zone == '@') {
    iVar5 = prev_rule->gmtofs;
  }
  else {
    if (this->at_zone != '\0') goto LAB_0028eb20;
    iVar5 = prev_rule->gmtofs + prev_rule->save;
  }
  *daytime = iVar6 - iVar5;
LAB_0028eb20:
  caldate_t::normalize(dayno,daytime);
  return;
}

Assistant:

void vmtz_rule::resolve(int32_t &dayno, int32_t &daytime, int year,
                        const vmtz_rule *prev_rule)
{
    /* set up our year and month; we have yet to work out the day */
    int w, delta;
    caldate_t cd(year, mm, 0);

    /* figure out the day according to our type */
    switch (when)
    {
    case 0:
        /* the rule takes effect on a the fixed day 'dd' */
        cd.d = dd;
        break;

    case 1:
        /* 
         *   The rule takes effect on the last <weekday> of the month.  Get
         *   the weekday of the last day of this month (which we can figure
         *   using day 0 of next month). 
         */
        cd.m += 1;
        w = cd.weekday() + 1;

        /* figure the days from mm/last to the previous target weekday */
        delta = w - weekday;
        if (delta < 0)
            delta += 7;

        /* go back that many days */
        cd.d -= delta;
        break;

    case 2:
        /* first <weekday> on or after <dd> - get the weekday of <dd> */
        cd.d = dd;
        w = cd.weekday() + 1;

        /* figure days between <dd> and the next <weekday> */
        delta = weekday - w;
        if (delta < 0)
            delta += 7;

        /* go ahead that many days */
        cd.d += delta;
        break;

    case 3:
        /* first <weekday> on or before <dd> - get the weekday of <dd> */
        cd.d = dd;
        w = cd.weekday() + 1;

        /* figure the days from <dd> to the next <weekday> */
        delta = weekday - w;
        if (delta < 0)
            delta += 7;

        /* go ahead that many days and back a week */
        cd.d += delta - 7;
        break;
    }

    /* we now have our effective date and time */
    dayno = cd.dayno();
    daytime = at;

    /* adjust the time zone */
    switch (at_zone)
    {
    case 0x80:
        /* the rule was stated in UTC, which is what we're after */
        break;

    case 0x00:
        /* 
         *   The rule was stated in local wall clock time, in the period in
         *   effect just before the rule.  That means we use the zone
         *   settings of the *previous* rule, which defines the period
         *   leading up to this rule's firing time.  Convert to UTC by
         *   subtracting the standard time offset plus the daylight offset
         *   for the prior period.
         */
        daytime -= prev_rule->gmtofs + prev_rule->save;
        break;

    case 0x40:
        /* 
         *   the rule was stated in local standard time, so subtract the
         *   standard time offset for the prior period 
         */
        daytime -= prev_rule->gmtofs;
        break;
    }

    /* normalize the time to keep it within 0-23:59:59 */
    caldate_t::normalize(dayno, daytime);
}